

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReorderGlobals.cpp
# Opt level: O3

double __thiscall
wasm::ReorderGlobals::computeSize(ReorderGlobals *this,IndexIndexMap *indices,IndexCountMap *counts)

{
  pointer puVar1;
  pointer puVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  double dVar7;
  
  puVar1 = (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar4 = (long)puVar2 - (long)puVar1 >> 2;
  if (this->always == false) {
    if (puVar2 != puVar1) {
      dVar7 = 0.0;
      uVar3 = 0;
      iVar5 = 0;
      uVar6 = 0;
      do {
        if ((int)uVar3 == iVar5) {
          iVar5 = 1 << (((char)uVar6 * '\b' + '\b') - (char)(uVar6 + 1) & 0x1fU);
          uVar6 = uVar6 + 1;
        }
        dVar7 = dVar7 + (double)uVar6 *
                        (counts->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[puVar1[uVar3]];
        uVar3 = uVar3 + 1;
      } while ((uVar3 & 0xffffffff) < uVar4);
      return dVar7;
    }
  }
  else if (puVar2 != puVar1) {
    dVar7 = 0.0;
    uVar3 = 0;
    do {
      dVar7 = dVar7 + ((double)(uVar3 & 0xffffffff) * 0.0078125 + 1.0) *
                      (counts->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[puVar1[uVar3]];
      uVar3 = uVar3 + 1;
    } while ((uVar3 & 0xffffffff) < uVar4);
    return dVar7;
  }
  return 0.0;
}

Assistant:

double computeSize(IndexIndexMap& indices, IndexCountMap& counts) {
    if (always) {
      // In this mode we gradually increase the cost of later globals, in an
      // unrealistic but smooth manner.
      double total = 0;
      for (Index i = 0; i < indices.size(); i++) {
        // Multiply the count for this global by a smoothed LEB factor, which
        // starts at 1 (for 1 byte) at index 0, and then increases linearly with
        // i, so that after 128 globals we reach 2 (which is the true index at
        // which the LEB size normally jumps from 1 to 2), and so forth.
        total += counts[indices[i]] * (1.0 + (i / 128.0));
      }
      return total;
    }

    // The total size we are computing.
    double total = 0;
    // Track the size in bits and the next index at which the size increases. At
    // the first iteration we'll compute the size of the LEB for index 0, and so
    // forth.
    Index sizeInBits = 0;
    Index nextSizeIncrease = 0;
    for (Index i = 0; i < indices.size(); i++) {
      if (i == nextSizeIncrease) {
        sizeInBits++;
        // At the current size we have 7 * sizeInBits bits to use.  For example,
        // at index 0 the size is 1 and we'll compute 128 here, and indeed after
        // emitting 128 globals (0,..,127) the 129th (at index 128) requires a
        // larger LEB.
        nextSizeIncrease = 1 << (7 * sizeInBits);
      }
      total += counts[indices[i]] * sizeInBits;
    }
    return total;
  }